

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::DrawTest::addIteration(DrawTest *this,DrawTestSpec *spec,char *description)

{
  char *__s;
  bool bVar1;
  reference this_00;
  value_type local_80;
  allocator<char> local_49;
  value_type local_48;
  deUint32 local_28;
  undefined1 local_22;
  undefined1 local_21;
  bool validContext;
  char *pcStack_20;
  bool validSpec;
  char *description_local;
  DrawTestSpec *spec_local;
  DrawTest *this_local;
  
  pcStack_20 = description;
  description_local = (char *)spec;
  spec_local = (DrawTestSpec *)this;
  local_21 = DrawTestSpec::valid(spec);
  if ((bool)local_21) {
    bVar1 = std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::empty
                      (&this->m_specs);
    if (!bVar1) {
      this_00 = std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::
                operator[](&this->m_specs,0);
      local_28 = *(deUint32 *)description_local;
      local_22 = glu::ApiType::operator==(&this_00->apiType,(ApiType)local_28);
      if (!(bool)local_22) {
        return;
      }
    }
    std::vector<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>::push_back
              (&this->m_specs,(value_type *)description_local);
    __s = pcStack_20;
    if (pcStack_20 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_iteration_descriptions,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_iteration_descriptions,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
  }
  return;
}

Assistant:

void DrawTest::addIteration (const DrawTestSpec& spec, const char* description)
{
	// Validate spec
	const bool validSpec = spec.valid();
	DE_ASSERT(validSpec);

	if (!validSpec)
		return;

	// Check the context type is the same with other iterations
	if (!m_specs.empty())
	{
		const bool validContext = m_specs[0].apiType == spec.apiType;
		DE_ASSERT(validContext);

		if (!validContext)
			return;
	}

	m_specs.push_back(spec);

	if (description)
		m_iteration_descriptions.push_back(std::string(description));
	else
		m_iteration_descriptions.push_back(std::string());
}